

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

la_proto_node *
v1v2_alo_alr_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen,
                  la_miam_core_pdu_type pdu_type)

{
  void *pvVar1;
  la_proto_node *plVar2;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  la_proto_node *node;
  la_miam_core_v1v2_alo_alr_pdu *pdu;
  undefined4 in_stack_00000028;
  
  pvVar1 = la_xcalloc((size_t)hdrbuf,CONCAT44(hdrlen,in_stack_00000028),(char *)bodybuf,bodylen,
                      (char *)pdu);
  plVar2 = la_proto_node_new();
  if (in_R8D == 2) {
    plVar2->td = &la_DEF_miam_core_v1v2_alo_pdu;
  }
  else if (in_R8D == 3) {
    plVar2->td = &la_DEF_miam_core_v1v2_alr_pdu;
  }
  plVar2->data = pvVar1;
  plVar2->next = (la_proto_node *)0x0;
  if (in_ESI < 0xd) {
    *(uint *)((long)pvVar1 + 8) = *(uint *)((long)pvVar1 + 8) | 8;
  }
  else {
    *(uint *)((long)pvVar1 + 0xc) =
         (uint)*(byte *)(in_RDI + 1) << 0x10 | (uint)*(byte *)(in_RDI + 2) << 8 |
         (uint)*(byte *)(in_RDI + 3);
    *(undefined4 *)((long)pvVar1 + 0x14) = *(undefined4 *)(in_RDI + 4);
    *(undefined2 *)((long)pvVar1 + 0x18) = *(undefined2 *)(in_RDI + 8);
    *(undefined1 *)((long)pvVar1 + 0x1a) = *(undefined1 *)(in_RDI + 10);
    *(undefined1 *)((long)pvVar1 + 0x1b) = 0;
    *(undefined1 *)((long)pvVar1 + 0x1c) = *(undefined1 *)(in_RDI + 0xb);
    *(undefined1 *)((long)pvVar1 + 0x1d) = *(undefined1 *)(in_RDI + 0xc);
  }
  return plVar2;
}

Assistant:

static la_proto_node *v1v2_alo_alr_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf,
		int bodylen, la_miam_core_pdu_type pdu_type) {
	LA_UNUSED(bodybuf);
	LA_UNUSED(bodylen);

	la_assert(hdrbuf != NULL);
	la_assert(pdu_type == LA_MIAM_CORE_PDU_ALO || pdu_type == LA_MIAM_CORE_PDU_ALR);

	LA_NEW(la_miam_core_v1v2_alo_alr_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	if(pdu_type == LA_MIAM_CORE_PDU_ALO) {
		node->td = &la_DEF_miam_core_v1v2_alo_pdu;
	} else if(pdu_type == LA_MIAM_CORE_PDU_ALR) {
		node->td = &la_DEF_miam_core_v1v2_alr_pdu;
	}
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 13) {       // should be 16, but let's not be overly pedantic on unused octets
		la_debug_print(D_ERROR, "Header too short: %d < 16\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	pdu->pdu_len = (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	hdrbuf += 4; hdrlen -= 4;

	memcpy(&pdu->aircraft_id, hdrbuf, 7);
	pdu->aircraft_id[7] = '\0';
	la_debug_print(D_INFO, "len: %u aircraft_id: %s\n", pdu->pdu_len, pdu->aircraft_id);
	hdrbuf += 7; hdrlen -= 7;

	pdu->compression = hdrbuf[0];
	pdu->networks = hdrbuf[1];
	la_debug_print(D_INFO, "compression: 0x%02x networks: 0x%02x\n",
			pdu->compression, pdu->networks);
end:
	return node;
}